

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::InfoCollector::handleIndirectCall<wasm::Call>
          (InfoCollector *this,Call *curr,HeapType targetType)

{
  Call *curr_00;
  bool bVar1;
  anon_class_8_1_ba798e29 local_70;
  function<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_(unsigned_int)>
  local_68;
  anon_class_8_1_ba798e29 local_48;
  function<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_(unsigned_int)>
  local_40;
  Call *local_20;
  Call *curr_local;
  InfoCollector *this_local;
  HeapType targetType_local;
  
  local_20 = curr;
  curr_local = (Call *)this;
  this_local = (InfoCollector *)targetType.id;
  bVar1 = HeapType::isSignature((HeapType *)&this_local);
  curr_00 = local_20;
  if (bVar1) {
    local_48.targetType = (HeapType *)&this_local;
    std::
    function<std::variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>(unsigned_int)>
    ::
    function<wasm::(anonymous_namespace)::InfoCollector::handleIndirectCall<wasm::Call>(wasm::Call*,wasm::HeapType)::_lambda(unsigned_int)_1_,void>
              ((function<std::variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>(unsigned_int)>
                *)&local_40,&local_48);
    local_70.targetType = (HeapType *)&this_local;
    std::
    function<std::variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>(unsigned_int)>
    ::
    function<wasm::(anonymous_namespace)::InfoCollector::handleIndirectCall<wasm::Call>(wasm::Call*,wasm::HeapType)::_lambda(unsigned_int)_2_,void>
              ((function<std::variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>(unsigned_int)>
                *)&local_68,&local_70);
    handleCall<wasm::Call>(this,curr_00,&local_40,&local_68);
    std::
    function<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_(unsigned_int)>
    ::~function(&local_68);
    std::
    function<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_(unsigned_int)>
    ::~function(&local_40);
  }
  else {
    bVar1 = HeapType::isBottom((HeapType *)&this_local);
    if (!bVar1) {
      __assert_fail("targetType.isBottom()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                    ,0x348,
                    "void wasm::(anonymous namespace)::InfoCollector::handleIndirectCall(T *, HeapType) [T = wasm::Call]"
                   );
    }
  }
  return;
}

Assistant:

void handleIndirectCall(T* curr, HeapType targetType) {
    // If the heap type is not a signature, which is the case for a bottom type
    // (null) then nothing can be called.
    if (!targetType.isSignature()) {
      assert(targetType.isBottom());
      return;
    }
    handleCall(
      curr,
      [&](Index i) {
        assert(i <= targetType.getSignature().params.size());
        return SignatureParamLocation{targetType, i};
      },
      [&](Index i) {
        assert(i <= targetType.getSignature().results.size());
        return SignatureResultLocation{targetType, i};
      });
  }